

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HMpsFF.cpp
# Opt level: O2

HighsInt __thiscall
free_format_parser::HMpsFF::fillMatrix(HMpsFF *this,HighsLogOptions *log_options)

{
  vector<int,_std::allocator<int>_> *this_00;
  vector<std::tuple<int,_int,_double>,_std::allocator<std::tuple<int,_int,_double>_>_> *this_01;
  double dVar1;
  int iVar2;
  int iVar3;
  pointer ptVar4;
  pointer ptVar5;
  pointer piVar6;
  ulong uVar7;
  uint uVar8;
  reference pvVar9;
  reference pvVar10;
  reference pvVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  int iVar15;
  long lVar16;
  HighsInt k;
  size_type sVar17;
  size_type __n;
  value_type_conflict2 local_34;
  
  ptVar4 = (this->entries).
           super__Vector_base<std::tuple<int,_int,_double>,_std::allocator<std::tuple<int,_int,_double>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ptVar5 = (this->entries).
           super__Vector_base<std::tuple<int,_int,_double>,_std::allocator<std::tuple<int,_int,_double>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  sVar17 = (long)ptVar5 - (long)ptVar4 >> 4;
  uVar8 = 1;
  if (sVar17 == (long)this->num_nz) {
    std::vector<double,_std::allocator<double>_>::resize(&this->a_value,sVar17);
    std::vector<int,_std::allocator<int>_>::resize(&this->a_index,(long)this->num_nz);
    this_00 = &this->a_start;
    local_34 = 0;
    std::vector<int,_std::allocator<int>_>::_M_fill_assign
              (this_00,(long)this->num_col + 1,&local_34);
    if (ptVar5 == ptVar4) {
      uVar8 = 0;
    }
    else {
      this_01 = &this->entries;
      pvVar9 = std::
               vector<std::tuple<int,_int,_double>,_std::allocator<std::tuple<int,_int,_double>_>_>
               ::at(this_01,0);
      iVar15 = *(int *)&(pvVar9->super__Tuple_impl<0UL,_int,_int,_double>).
                        super__Tuple_impl<1UL,_int,_double>.field_0xc;
      for (sVar17 = 0; iVar2 = this->num_nz, (long)sVar17 < (long)iVar2; sVar17 = sVar17 + 1) {
        pvVar9 = std::
                 vector<std::tuple<int,_int,_double>,_std::allocator<std::tuple<int,_int,_double>_>_>
                 ::at(this_01,sVar17);
        dVar1 = (pvVar9->super__Tuple_impl<0UL,_int,_int,_double>).
                super__Tuple_impl<1UL,_int,_double>.super__Tuple_impl<2UL,_double>.
                super__Head_base<2UL,_double,_false>._M_head_impl;
        pvVar10 = std::vector<double,_std::allocator<double>_>::at(&this->a_value,sVar17);
        *pvVar10 = dVar1;
        pvVar9 = std::
                 vector<std::tuple<int,_int,_double>,_std::allocator<std::tuple<int,_int,_double>_>_>
                 ::at(this_01,sVar17);
        iVar2 = (pvVar9->super__Tuple_impl<0UL,_int,_int,_double>).
                super__Tuple_impl<1UL,_int,_double>.super__Head_base<1UL,_int,_false>._M_head_impl;
        pvVar11 = std::vector<int,_std::allocator<int>_>::at(&this->a_index,sVar17);
        *pvVar11 = iVar2;
        pvVar9 = std::
                 vector<std::tuple<int,_int,_double>,_std::allocator<std::tuple<int,_int,_double>_>_>
                 ::at(this_01,sVar17);
        if (*(int *)&(pvVar9->super__Tuple_impl<0UL,_int,_int,_double>).
                     super__Tuple_impl<1UL,_int,_double>.field_0xc != iVar15) {
          pvVar9 = std::
                   vector<std::tuple<int,_int,_double>,_std::allocator<std::tuple<int,_int,_double>_>_>
                   ::at(this_01,sVar17);
          iVar2 = *(int *)&(pvVar9->super__Tuple_impl<0UL,_int,_int,_double>).
                           super__Tuple_impl<1UL,_int,_double>.field_0xc;
          pvVar9 = std::
                   vector<std::tuple<int,_int,_double>,_std::allocator<std::tuple<int,_int,_double>_>_>
                   ::at(this_01,sVar17);
          iVar3 = *(int *)&(pvVar9->super__Tuple_impl<0UL,_int,_int,_double>).
                           super__Tuple_impl<1UL,_int,_double>.field_0xc;
          if (this->num_col <= iVar3) {
            return 1;
          }
          __n = (size_type)iVar3;
          lVar12 = (long)iVar15;
          pvVar11 = std::vector<int,_std::allocator<int>_>::at(this_00,__n);
          *pvVar11 = (value_type)sVar17;
          for (lVar16 = 1; __n = __n - 1, iVar15 = iVar3, lVar16 < iVar2 - lVar12;
              lVar16 = lVar16 + 1) {
            pvVar11 = std::vector<int,_std::allocator<int>_>::at(this_00,__n);
            *pvVar11 = (value_type)sVar17;
          }
        }
      }
      lVar16 = (long)iVar15;
      piVar6 = (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      while( true ) {
        uVar8 = this->num_col;
        if ((int)uVar8 <= lVar16) break;
        piVar6[lVar16 + 1] = iVar2;
        lVar16 = lVar16 + 1;
      }
      piVar6 = (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar13 = 0;
      uVar7 = 0;
      if (0 < (int)uVar8) {
        uVar13 = (ulong)uVar8;
      }
      do {
        uVar14 = uVar7;
        if (uVar13 == uVar14) goto LAB_0022292a;
        uVar7 = uVar14 + 1;
      } while (piVar6[uVar14] <= piVar6[uVar14 + 1]);
      highsLogUser(log_options,kError,"Non-monotonic starts in MPS file reader\n");
LAB_0022292a:
      uVar8 = (uint)((long)uVar14 < (long)(int)uVar8);
    }
  }
  return uVar8;
}

Assistant:

HighsInt HMpsFF::fillMatrix(const HighsLogOptions& log_options) {
  size_t num_entries = entries.size();
  if (num_entries != static_cast<size_t>(num_nz)) return 1;

  a_value.resize(num_nz);
  a_index.resize(num_nz);
  a_start.assign(num_col + 1, 0);
  // Nothing to do if there are no entries in the matrix
  if (!num_entries) return 0;

  HighsInt newColIndex = std::get<0>(entries.at(0));

  for (HighsInt k = 0; k < num_nz; k++) {
    a_value.at(k) = std::get<2>(entries.at(k));
    a_index.at(k) = std::get<1>(entries.at(k));

    if (std::get<0>(entries.at(k)) != newColIndex) {
      HighsInt nEmptyCols = std::get<0>(entries.at(k)) - newColIndex;
      newColIndex = std::get<0>(entries.at(k));
      if (newColIndex >= num_col) return 1;

      a_start.at(newColIndex) = k;
      for (HighsInt i = 1; i < nEmptyCols; i++) {
        a_start.at(newColIndex - i) = k;
      }
    }
  }

  for (HighsInt col = newColIndex + 1; col <= num_col; col++)
    a_start[col] = num_nz;

  for (HighsInt i = 0; i < num_col; i++) {
    if (a_start[i] > a_start[i + 1]) {
      highsLogUser(log_options, HighsLogType::kError,
                   "Non-monotonic starts in MPS file reader\n");
      return 1;
    }
  }

  return 0;
}